

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

string * sciplot::gnuplot::cleanpath(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  string invalidchars;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,":*?!\"<>|","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  _Var2._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<sciplot::gnuplot::cleanpath(std::__cxx11::string)::_lambda(char)_1_>>
                    (_Var2,_Var2._M_current + __return_storage_ptr__->_M_string_length,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_HorstBaerbel[P]approx_sciplot_sciplot_Utils_hpp:323:63)>
                      )local_40);
  __return_storage_ptr__->_M_string_length =
       (long)_Var2._M_current - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *_Var2._M_current = '\0';
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto cleanpath(std::string path) -> std::string
{
    const std::string invalidchars = ":*?!\"<>|";
    std::string result = path;
    result.erase(std::remove_if(result.begin(), result.end(), [&invalidchars](char c) { return (std::find(invalidchars.cbegin(), invalidchars.cend(), c) != invalidchars.cend()); }), result.end());
    return result;
}